

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test3::prepareUniformBuffer
          (GPUShaderFP64Test3 *this,programInfo *program_info,bool verify_offsets)

{
  uint uVar1;
  int iVar2;
  char *__s;
  ulong uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  pointer puVar9;
  uint uVar10;
  ulong uVar11;
  pointer puVar12;
  int *piVar13;
  bool bVar14;
  ulong __new_size;
  double dVar15;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_data;
  int *local_1e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d8;
  long local_1c0;
  programInfo *local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  __new_size = (ulong)(uint)program_info->m_buffer_size;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  puVar9 = (this->m_uniform_details).
           super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar13 = (program_info->m_uniform_offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1e0 = (program_info->m_uniform_matrix_strides).super__Vector_base<int,_std::allocator<int>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8 = program_info;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1d8,__new_size);
  puVar12 = (this->m_uniform_details).
            super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 == puVar9) {
    bVar14 = true;
    lVar8 = CONCAT44(extraout_var,iVar4);
  }
  else {
    uVar7 = 1;
    bVar14 = true;
    local_1c0 = CONCAT44(extraout_var,iVar4);
    do {
      uVar1 = puVar9->m_n_elements;
      uVar3 = (ulong)uVar1 / (ulong)puVar9->m_n_columns;
      iVar4 = *piVar13;
      if (uVar1 != 0) {
        iVar2 = *local_1e0;
        uVar11 = 0;
        dVar15 = 0.0;
        do {
          *(double *)
           (local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start +
           (uint)((int)(uVar11 / uVar3) * iVar2 + iVar4 + (int)(uVar11 % uVar3) * 8)) =
               (this->m_base_element - dVar15) * 0.25 +
               (double)uVar7 * 13.0 + this->m_base_type_ordinal;
          dVar15 = dVar15 + 1.0;
          uVar10 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar10;
        } while (uVar1 != uVar10);
      }
      if ((verify_offsets) && (iVar2 = puVar9->m_expected_std140_offset, iVar2 != iVar4)) {
        if (bVar14) {
          local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        }
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Uniform: ",9);
        __s = puVar9->m_name;
        if (__s == (char *)0x0) {
          std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
        }
        else {
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," has offset: ",0xd)
        ;
        std::ostream::operator<<((ostringstream *)local_1a8,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,". Expected offset: ",0x13);
        std::ostream::operator<<((ostringstream *)local_1a8,iVar2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        puVar12 = (this->m_uniform_details).
                  super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        bVar14 = false;
      }
      puVar9 = puVar9 + 1;
      piVar13 = piVar13 + 1;
      local_1e0 = local_1e0 + 1;
      uVar7 = uVar7 + 1;
      lVar8 = local_1c0;
    } while (puVar12 != puVar9);
  }
  (**(code **)(lVar8 + 0x40))(0x8a11,this->m_uniform_buffer_id);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1472);
  (**(code **)(lVar8 + 0x150))
            (0x8a11,__new_size,
             local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1475);
  (**(code **)(lVar8 + 0x50))(0x8a11,0,this->m_uniform_buffer_id,0,__new_size);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"BindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1479);
  (**(code **)(lVar8 + 0x15d0))(local_1b8->m_program_object_id,local_1b8->m_uniform_block_index,0);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"UniformBlockBinding",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x147c);
  if (local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar14;
}

Assistant:

bool GPUShaderFP64Test3::prepareUniformBuffer(const programInfo& program_info, bool verify_offsets) const
{
	const glw::GLuint							buffer_size = program_info.m_buffer_size;
	const glw::Functions&						gl			= m_context.getRenderContext().getFunctions();
	bool										offset_verification_result = true;
	glw::GLuint									type_ordinal			   = 1;
	std::vector<uniformDetails>::const_iterator it_uniform_details		   = m_uniform_details.begin();
	std::vector<glw::GLint>::const_iterator		it_uniform_offsets		   = program_info.m_uniform_offsets.begin();
	std::vector<glw::GLint>::const_iterator it_uniform_matrix_strides = program_info.m_uniform_matrix_strides.begin();

	/* Prepare storage for uniform buffer data */
	std::vector<glw::GLubyte> buffer_data;
	buffer_data.resize(buffer_size);

	/* For each "double precision" uniform */
	for (/* start conditions already set up */; m_uniform_details.end() != it_uniform_details;
		 ++it_uniform_details, ++it_uniform_offsets, ++it_uniform_matrix_strides, ++type_ordinal)
	{
		const glw::GLint  matrix_stride  = *it_uniform_matrix_strides;
		const glw::GLuint n_columns		 = it_uniform_details->m_n_columns;
		const glw::GLuint n_elements	 = it_uniform_details->m_n_elements;
		const glw::GLuint column_length  = n_elements / n_columns;
		const glw::GLint  uniform_offset = *it_uniform_offsets;

		/* For each element of uniform */
		for (glw::GLuint element = 0; element < n_elements; ++element)
		{
			const glw::GLuint   column		= element / column_length;
			const glw::GLuint   column_elem = element % column_length;
			const glw::GLdouble value		= getExpectedValue(type_ordinal, element);
			const glw::GLuint   value_offset =
				static_cast<glw::GLuint>(uniform_offset + column * matrix_stride + column_elem * sizeof(glw::GLdouble));

			glw::GLdouble* value_dst = (glw::GLdouble*)&buffer_data[value_offset];

			/* Store value */
			*value_dst = value;
		}

		/* Uniform offset verification */
		if (true == verify_offsets)
		{
			const glw::GLint expected_offset = it_uniform_details->m_expected_std140_offset;

			if (expected_offset != uniform_offset)
			{
				if (true == offset_verification_result)
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error" << tcu::TestLog::EndMessage;
				}

				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Uniform: " << it_uniform_details->m_name
					<< " has offset: " << uniform_offset << ". Expected offset: " << expected_offset
					<< tcu::TestLog::EndMessage;

				offset_verification_result = false;
			}
		}
	}

	/* Update uniform buffer with prepared data */
	gl.bindBuffer(GL_UNIFORM_BUFFER, m_uniform_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	gl.bufferData(GL_UNIFORM_BUFFER, buffer_size, &buffer_data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");

	/* Bind uniform buffer as data source for named uniform block */
	gl.bindBufferRange(GL_UNIFORM_BUFFER, 0 /* index */, m_uniform_buffer_id, 0, buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferRange");

	gl.uniformBlockBinding(program_info.m_program_object_id, program_info.m_uniform_block_index, 0 /* binding */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformBlockBinding");

	/* Done */
	return offset_verification_result;
}